

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O0

ostream * operator<<(ostream *os,pizza_slice ps)

{
  ostream *poVar1;
  ostream *os_local;
  pizza_slice ps_local;
  
  os_local._0_4_ = ps.row1;
  poVar1 = (ostream *)std::ostream::operator<<(os,(int)os_local);
  poVar1 = std::operator<<(poVar1,' ');
  os_local._4_4_ = ps.col1;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,os_local._4_4_);
  poVar1 = std::operator<<(poVar1,' ');
  ps_local.row1 = ps.row2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ps_local.row1);
  poVar1 = std::operator<<(poVar1,' ');
  ps_local.col1 = ps.col2;
  std::ostream::operator<<(poVar1,ps_local.col1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, pizza_slice ps) noexcept
{
    os << ps.row1 << ' ' << ps.col1 << ' ' << ps.row2 << ' ' << ps.col2;
    return os;
}